

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanNumber
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  char16 *c_00;
  char16_t *psz;
  bool bVar1;
  BOOL BVar2;
  ParseTokenKind PVar3;
  double value;
  LikelyNumberType local_34;
  char16_t cStack_30;
  undefined6 uStack_2e;
  LikelyNumberType likelyint;
  char16 *end;
  char16 c;
  
  c_00 = (char16 *)((long)&end + 6);
  end._6_2_ = 0;
  while( true ) {
    bVar1 = FileReader::PeekRawChar(&this->super_FileReader,c_00);
    if ((!bVar1) || (end._6_2_ != 0x2e && 9 < (ushort)(end._6_2_ - 0x30U))) break;
    FileReader::ReadRawChar(&this->super_FileReader,c_00);
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (charList,c_00);
  }
  cStack_30 = L'\0';
  JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (charList,&stack0xffffffffffffffd0);
  psz = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer;
  PVar3 = Error;
  value = Js::NumberUtilities::StrToDbl<char16_t>
                    (psz,(char16_t **)&stack0xffffffffffffffd0,&local_34,false,false);
  if (psz != (char16_t *)CONCAT62(uStack_2e,cStack_30)) {
    BVar2 = Js::JavascriptNumber::IsNan(value);
    if (BVar2 != 0) {
      TTDAbort_unrecoverable_error("Bad result from string to double conversion");
    }
    PVar3 = Number;
  }
  return PVar3;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanNumber(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        while(this->PeekRawChar(&c) && ((_u('0') <= c && c <= _u('9')) || (c == _u('.'))))
        {
            this->ReadRawChar(&c);
            charList.Add(c);
        }

        // Null-terminate the list before we try to use the buffer as a string.
        charList.Add(_u('\0'));

        LikelyNumberType likelyint; //we don't care about this just want to know that it is convertable to a number
        const char16* end;
        const char16* start = charList.GetBuffer();
        double val = Js::NumberUtilities::StrToDbl<char16>(start, &end, likelyint);
        if(start == end)
        {
            return NSTokens::ParseTokenKind::Error;
        }
        TTDAssert(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");

        return NSTokens::ParseTokenKind::Number;
    }